

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_route.c
# Opt level: O1

int csp_route_work(void)

{
  csp_id_t_conflict idin;
  _Bool _Var1;
  int iVar2;
  csp_iface_t *pcVar3;
  csp_callback_t p_Var4;
  csp_socket_t *pcVar5;
  bool bVar6;
  csp_packet_t *packet;
  csp_conn_t *conn;
  csp_qfifo_t input;
  csp_packet_t *local_30;
  csp_conn_t *local_28;
  csp_qfifo_t local_20;
  
  csp_conn_check_timeouts();
  iVar2 = csp_qfifo_read(&local_20);
  if (iVar2 != 0) {
    return -3;
  }
  local_30 = local_20.packet;
  if (local_20.packet == (csp_packet_t *)0x0) {
    return -3;
  }
  csp_input_hook(local_20.iface,local_20.packet);
  (local_20.iface)->rx = (local_20.iface)->rx + 1;
  (local_20.iface)->rxbytes = (local_20.iface)->rxbytes + (uint)local_30->length;
  pcVar3 = csp_iflist_get_by_addr((local_30->id).dst);
  bVar6 = true;
  if (pcVar3 == (csp_iface_t *)0x0) {
    iVar2 = csp_id_is_broadcast((local_30->id).dst,local_20.iface);
    bVar6 = iVar2 != 0;
  }
  if (((bool)((csp_conf.dedup == '\x02' & bVar6 ^ 1U) & csp_conf.dedup != '\x03' &
             (csp_conf.dedup != '\x01' | bVar6))) ||
     (_Var1 = csp_dedup_is_duplicate(local_30), !_Var1)) {
    csp_promisc_add(local_30);
    if (!bVar6) {
      csp_send_direct((csp_id_t_conflict *)&local_30->id,local_30,local_20.iface);
      return 0;
    }
    p_Var4 = csp_port_get_callback((uint)(local_30->id).dport);
    if (p_Var4 == (csp_callback_t)0x0) {
      pcVar5 = csp_port_get_socket((uint)(local_30->id).dport);
      if ((pcVar5 == (csp_socket_t *)0x0) || ((pcVar5->opts >> 8 & 1) == 0)) {
        local_28 = csp_conn_find_existing((csp_id_t_conflict *)&local_30->id);
        if (local_28 == (csp_conn_t *)0x0) {
          if ((pcVar5 == (csp_socket_t *)0x0) ||
             (iVar2 = csp_route_security_check(pcVar5->opts,local_20.iface,local_30), iVar2 != 0))
          goto LAB_00108bd1;
          idin.pri = (local_30->id).pri;
          idin.flags = (local_30->id).flags;
          idin.src = (local_30->id).src;
          idin.dst = (local_30->id).dst;
          idin.dport = (local_30->id).dport;
          idin.sport = (local_30->id).sport;
          local_28 = csp_conn_new(idin,(csp_id_t_conflict)
                                       ((ulong)(local_30->id).flags << 8 |
                                       (ulong)(local_30->id).dst << 0x10 | (ulong)(local_30->id).pri
                                       | (ulong)(local_30->id).src << 0x20 |
                                       (ulong)(local_30->id).sport << 0x30 |
                                       (ulong)(local_30->id).dport << 0x38),CONN_SERVER);
          if (local_28 == (csp_conn_t *)0x0) {
            csp_dbg_conn_out = csp_dbg_conn_out + '\x01';
            csp_buffer_free(local_30);
            return 0;
          }
          local_28->dest_socket = pcVar5;
          local_28->opts = pcVar5->opts;
        }
        else {
          iVar2 = csp_route_security_check(local_28->opts,local_20.iface,local_30);
          if (iVar2 != 0) goto LAB_00108bd1;
        }
        if (((local_30->id).flags & 2) == 0) {
          iVar2 = csp_conn_enqueue_packet(local_28,local_30);
          if (iVar2 != 0) {
            csp_dbg_conn_ovf = csp_dbg_conn_ovf + '\x01';
            goto LAB_00108bd1;
          }
          if (local_28->dest_socket == (csp_socket_t *)0x0) {
            return 0;
          }
          iVar2 = csp_queue_enqueue(local_28->dest_socket->rx_queue,&local_28,0);
          if (iVar2 == 0) {
            local_28->dest_socket = (csp_socket_t *)0x0;
            return 0;
          }
          csp_dbg_conn_ovf = csp_dbg_conn_ovf + '\x01';
        }
        else {
          _Var1 = csp_rdp_new_packet(local_28,local_30);
          if (!_Var1) {
            return 0;
          }
        }
        csp_close(local_28);
        return 0;
      }
      iVar2 = csp_route_security_check(pcVar5->opts,local_20.iface,local_30);
      if (iVar2 == 0) {
        iVar2 = csp_queue_enqueue(pcVar5->rx_queue,&local_30,0);
        if (iVar2 != 0) {
          csp_dbg_conn_ovf = csp_dbg_conn_ovf + '\x01';
          csp_buffer_free(local_30);
          return 0;
        }
        return 0;
      }
    }
    else {
      iVar2 = csp_route_security_check(0x40,local_20.iface,local_30);
      if (iVar2 == 0) {
        (*p_Var4)(local_30);
        return 0;
      }
    }
  }
  else {
    (local_20.iface)->drop = (local_20.iface)->drop + 1;
  }
LAB_00108bd1:
  csp_buffer_free(local_30);
  return 0;
}

Assistant:

int csp_route_work(void) {

	csp_qfifo_t input;
	csp_packet_t * packet;
	csp_conn_t * conn;
	csp_socket_t * socket;

#if (CSP_USE_RDP)
	/* Check connection timeouts (currently only for RDP) */
	csp_conn_check_timeouts();
#endif

	/* Get next packet to route */
	if (csp_qfifo_read(&input) != CSP_ERR_NONE) {
		return CSP_ERR_TIMEDOUT;
	}

	packet = input.packet;
	if (packet == NULL) {
		return CSP_ERR_TIMEDOUT;
	}

	csp_input_hook(input.iface, packet);

	/* Count the message */
	input.iface->rx++;
	input.iface->rxbytes += packet->length;

	/* The packet is to me, if the address matches that of any interface,
	 * or the address matches the broadcast address of the incoming interface */
	int is_to_me = (csp_iflist_get_by_addr(packet->id.dst) != NULL || (csp_id_is_broadcast(packet->id.dst, input.iface)));

	/* Deduplication */
	if ((csp_conf.dedup == CSP_DEDUP_ALL) ||
		((is_to_me) && (csp_conf.dedup == CSP_DEDUP_INCOMING)) ||
		((!is_to_me) && (csp_conf.dedup == CSP_DEDUP_FWD))) {
		if (csp_dedup_is_duplicate(packet)) {
			/* Discard packet */
			input.iface->drop++;
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}
	}

	/* Here there be promiscuous mode */
#if (CSP_USE_PROMISC)
	csp_promisc_add(packet);
#endif

	/* If the message is not to me, route the message to the correct interface */
	if (!is_to_me) {

		/* Otherwise, actually send the message */
		csp_send_direct(&packet->id, packet, input.iface);
		return CSP_ERR_NONE;

	}

	/* Discard packets with unsupported options */
	if (csp_route_check_options(input.iface, packet) != CSP_ERR_NONE) {
		csp_buffer_free(packet);
		return CSP_ERR_NONE;
	}

	/**
	 * Callbacks 
	 */
	csp_callback_t callback = csp_port_get_callback(packet->id.dport);
	if (callback) {

		if (csp_route_security_check(CSP_SO_CRC32REQ, input.iface, packet) != CSP_ERR_NONE) {
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}

		callback(packet);
		return CSP_ERR_NONE;
	}

	/**
	 * Sockets 
	 */

	/* The message is to me, search for incoming socket */
	socket = csp_port_get_socket(packet->id.dport);

	/* If the socket is connection-less, deliver now */
	if (socket && (socket->opts & CSP_SO_CONN_LESS)) {

		if (csp_route_security_check(socket->opts, input.iface, packet) != CSP_ERR_NONE) {
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}

		if (csp_queue_enqueue(socket->rx_queue, &packet, 0) != CSP_QUEUE_OK) {
			csp_dbg_conn_ovf++;
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}
		
		return CSP_ERR_NONE;
	}

	/* Search for an existing connection */
	conn = csp_conn_find_existing(&packet->id);

	/* If this is an incoming packet on a new connection */
	if (conn == NULL) {

		/* Reject packet if no matching socket is found */
		if (!socket) {
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}

		/* Run security check on incoming packet */
		if (csp_route_security_check(socket->opts, input.iface, packet) != CSP_ERR_NONE) {
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}

		/* New incoming connection accepted */
		csp_id_t idout;
		idout.pri = packet->id.pri;
		idout.src = packet->id.dst;
		idout.dst = packet->id.src;
		idout.dport = packet->id.sport;
		idout.sport = packet->id.dport;
		idout.flags = packet->id.flags;

		/* Create connection */
		conn = csp_conn_new(packet->id, idout, CONN_SERVER);

		if (!conn) {
			csp_dbg_conn_out++;
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}

		/* Store the socket queue and options */
		conn->dest_socket = socket;
		conn->opts = socket->opts;

		/* Packet to existing connection */
	} else {

		/* Run security check on incoming packet */
		if (csp_route_security_check(conn->opts, input.iface, packet) != CSP_ERR_NONE) {
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}
	}

#if (CSP_USE_RDP)
	/* Pass packet to RDP module */
	if (packet->id.flags & CSP_FRDP) {
		bool close_connection = csp_rdp_new_packet(conn, packet);
		if (close_connection) {
			csp_close(conn);
		}
		return CSP_ERR_NONE;
	}
#endif

	/* Otherwise, enqueue directly */
	if (csp_conn_enqueue_packet(conn, packet) != CSP_ERR_NONE) {
		csp_dbg_conn_ovf++;
		csp_buffer_free(packet);
		return CSP_ERR_NONE;
	}

	/* Try to queue up the new connection pointer */
	if (conn->dest_socket != NULL) {
		if (csp_queue_enqueue(conn->dest_socket->rx_queue, &conn, 0) != CSP_QUEUE_OK) {
			csp_dbg_conn_ovf++;
			csp_close(conn);
			return CSP_ERR_NONE;
		}

		/* Ensure that this connection will not be posted to this socket again */
		conn->dest_socket = NULL;
	}

	return CSP_ERR_NONE;
}